

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex-match.c
# Opt level: O1

int regex_compile(regex_t *r,char *regex_text)

{
  int __errcode;
  char error_message [4096];
  char acStack_1018 [4096];
  
  __errcode = regcomp((regex_t *)r,regex_text,5);
  if (__errcode != 0) {
    regerror(__errcode,(regex_t *)r,acStack_1018,0x1000);
    printf("Regex error compiling \'%s\': %s\n",regex_text,acStack_1018);
  }
  return (uint)(__errcode != 0);
}

Assistant:

int regex_compile (regex_t * r, const char * regex_text)
{
#ifdef WITH_APPLE
    int status = regcomp (r, regex_text, REG_EXTENDED|REG_ENHANCED|REG_NEWLINE);
#endif
#ifdef WITH_LINUX
    int status = regcomp (r, regex_text, REG_EXTENDED|REG_NEWLINE);
#endif
    if (status != 0)
    {
        char error_message[MAX_ERROR_MSG];
        regerror (status, r, error_message, MAX_ERROR_MSG);
        printf ("Regex error compiling '%s': %s\n",
                regex_text, error_message);
        return 1;
    }
    return 0;
}